

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O2

ctmbstr FindStyle(TidyDocImpl *doc,ctmbstr tag,ctmbstr properties)

{
  int iVar1;
  TagStyle *pTVar2;
  tmbstr ptVar3;
  char *pcVar4;
  TagStyle **ppTVar5;
  TagStyle **ppTVar6;
  tmbchar buf [512];
  
  ppTVar6 = &doc->lexer->styles;
  ppTVar5 = ppTVar6;
  while (pTVar2 = *ppTVar5, pTVar2 != (TagStyle *)0x0) {
    iVar1 = prvTidytmbstrcmp(pTVar2->tag,tag);
    if ((iVar1 == 0) && (iVar1 = prvTidytmbstrcmp(pTVar2->properties,properties), iVar1 == 0))
    goto LAB_00147e1d;
    ppTVar5 = &pTVar2->next;
  }
  pTVar2 = (TagStyle *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x20);
  ptVar3 = prvTidytmbstrdup(doc->allocator,tag);
  pTVar2->tag = ptVar3;
  pcVar4 = (doc->config).value[10].p;
  if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
    pcVar4 = anon_var_dwarf_1b044 + 0x22;
  }
  doc->nClassId = doc->nClassId + 1;
  prvTidytmbsnprintf(buf,0x200,"%s%u",pcVar4);
  ptVar3 = prvTidytmbstrdup(doc->allocator,buf);
  pTVar2->tag_class = ptVar3;
  ptVar3 = prvTidytmbstrdup(doc->allocator,properties);
  pTVar2->properties = ptVar3;
  pTVar2->next = *ppTVar6;
  *ppTVar6 = pTVar2;
LAB_00147e1d:
  return pTVar2->tag_class;
}

Assistant:

static ctmbstr FindStyle( TidyDocImpl* doc, ctmbstr tag, ctmbstr properties )
{
    Lexer* lexer = doc->lexer;
    TagStyle* style;

    for (style = lexer->styles; style; style=style->next)
    {
        if (TY_(tmbstrcmp)(style->tag, tag) == 0 &&
            TY_(tmbstrcmp)(style->properties, properties) == 0)
            return style->tag_class;
    }

    style = (TagStyle *)TidyDocAlloc( doc, sizeof(TagStyle) );
    style->tag = TY_(tmbstrdup)(doc->allocator, tag);
    style->tag_class = GensymClass( doc );
    style->properties = TY_(tmbstrdup)( doc->allocator, properties );
    style->next = lexer->styles;
    lexer->styles = style;
    return style->tag_class;
}